

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ranges.cpp
# Opt level: O1

void test_parse_and_check_false
               (string_view range_str,string_view ver_str,version_compare_option option)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  pointer prVar1;
  Flags resultDisposition;
  __normal_iterator<semver::detail::range<int,_int,_int>_*,_std::vector<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>_>
  _Var2;
  char *pcVar3;
  undefined7 in_register_00000081;
  from_chars_result fVar4;
  string_view str;
  string_view str_00;
  range_set<int,_int,_int> rs;
  AssertionHandler catchAssertionHandler;
  version<int,_int,_int> v;
  ScopedMessage scopedMessage1;
  SourceLineInfo local_1b0;
  undefined4 local_19c;
  vector<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  local_198;
  SourceLineInfo local_178;
  AssertionHandler local_168;
  char *local_120;
  StringRef local_118;
  undefined1 local_108 [32];
  ostream local_e8;
  undefined7 uStack_e7;
  _Alloc_hider local_e0;
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  local_b8;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage local_80;
  
  pcVar3 = range_str._M_str;
  local_19c = (undefined4)CONCAT71(in_register_00000081,option);
  local_168.m_assertionInfo.macroName.m_start = "INFO";
  local_168.m_assertionInfo.macroName.m_size = 4;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x170228;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x16;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_108,(StringRef *)&local_168,(SourceLineInfo *)&local_198,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_108._16_8_,pcVar3,(long)range_str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_108._16_8_," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_108._16_8_,ver_str._M_str,(long)ver_str._M_len);
  Catch::ScopedMessage::ScopedMessage(&local_80,(MessageBuilder *)local_108);
  local_120 = pcVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_108);
  local_108._0_8_ = (_func_int **)0x100000000;
  local_108._8_4_ = 0;
  local_108._16_8_ = &local_e8;
  local_108._24_8_ = (char *)0x0;
  local_e8 = (ostream)0x0;
  local_d8 = local_d0._M_local_buf + 8;
  local_d0._M_allocated_capacity = 0;
  local_d0._M_local_buf[8] = '\0';
  local_b8.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x16fc9b;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
  local_1b0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_1b0.line = 0x19;
  Catch::StringRef::StringRef(&local_90,"semver::parse(ver_str, v)");
  capturedExpression_00.m_size = local_90.m_size;
  capturedExpression_00.m_start = local_90.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_198,&local_1b0,capturedExpression_00,Normal);
  str._M_str = local_108;
  str._M_len = (size_t)ver_str._M_str;
  fVar4 = semver::detail::parse<int,int,int>
                    ((detail *)ver_str._M_len,str,(version<int,_int,_int> *)local_90.m_start);
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)fVar4.super_from_chars_result.ptr;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_198.
                         super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         fVar4.super_from_chars_result.ec);
  local_1b0.file = (char *)&local_198;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&local_168,(ExprLhs<const_semver::from_chars_result_&> *)&local_1b0);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (range<int,_int,_int> *)0x0;
  local_198.
  super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.file = "REQUIRE";
  local_1b0.line = 7;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_178.line = 0x1c;
  Catch::StringRef::StringRef(&local_a0,"semver::parse(range_str, rs)");
  capturedExpression.m_size = local_a0.m_size;
  capturedExpression.m_start = local_a0.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_1b0,&local_178,capturedExpression,Normal);
  str_00._M_str = (char *)&local_198;
  str_00._M_len = (size_t)local_120;
  fVar4 = semver::parse<int,int,int>
                    ((semver *)range_str._M_len,str_00,(range_set<int,_int,_int> *)local_a0.m_start)
  ;
  local_1b0.file = fVar4.super_from_chars_result.ptr;
  local_1b0.line = CONCAT44(local_1b0.line._4_4_,fVar4.super_from_chars_result.ec);
  local_178.file = (char *)&local_1b0;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&local_168,(ExprLhs<const_semver::from_chars_result_&> *)&local_178);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1b0.file = "REQUIRE_FALSE";
  local_1b0.line = 0xd;
  local_178.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp";
  local_178.line = 0x1e;
  Catch::StringRef::StringRef(&local_118,"rs.contains(v, option)");
  resultDisposition = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&local_168,(StringRef *)&local_1b0,&local_178,local_118,resultDisposition);
  prVar1 = local_198.
           super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0.file = (char *)CONCAT71(local_1b0.file._1_7_,(char)local_19c);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<semver::detail::range<int,int,int>*,std::vector<semver::detail::range<int,int,int>,std::allocator<semver::detail::range<int,int,int>>>>,__gnu_cxx::__ops::_Iter_pred<semver::range_set<int,int,int>::contains(semver::version<int,int,int>const&,semver::version_compare_option)::_lambda(auto:1_const&)_1_>>
                    (local_198.
                     super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_198.
                     super__Vector_base<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_108);
  local_178.file = (char *)CONCAT71(local_178.file._1_7_,_Var2._M_current != prVar1);
  Catch::AssertionHandler::handleExpr<bool>(&local_168,(ExprLhs<bool> *)&local_178);
  Catch::AssertionHandler::complete(&local_168);
  if (local_168.m_completed == false) {
    (*(local_168.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::
  vector<semver::detail::range<int,_int,_int>,_std::allocator<semver::detail::range<int,_int,_int>_>_>
  ::~vector(&local_198);
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&local_b8);
  if (local_d8 != local_d0._M_local_buf + 8) {
    operator_delete(local_d8,CONCAT71(local_d0._9_7_,local_d0._M_local_buf[8]) + 1);
  }
  if ((ostream *)local_108._16_8_ != &local_e8) {
    operator_delete((void *)local_108._16_8_,CONCAT71(uStack_e7,local_e8) + 1);
  }
  Catch::ScopedMessage::~ScopedMessage(&local_80);
  return;
}

Assistant:

static void test_parse_and_check_false(std::string_view range_str, std::string_view ver_str,
  semver::version_compare_option option = semver::version_compare_option::exclude_prerelease)
{
  INFO(range_str << " : " << ver_str);

  semver::version v;
  REQUIRE(semver::parse(ver_str, v));

  semver::range_set rs;
  REQUIRE(semver::parse(range_str, rs));

  REQUIRE_FALSE(rs.contains(v, option));
}